

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CastInstr *castInstr)

{
  Opcode opc;
  LiteralType LVar1;
  Value *value;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  long lVar5;
  undefined1 local_149;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined4 local_140;
  undefined2 local_13c;
  undefined1 local_138 [64];
  undefined4 local_f8;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (visit(flow::CastInstr&)::map == '\0') {
    iVar2 = __cxa_guard_acquire(&visit(flow::CastInstr&)::map);
    if (iVar2 != 0) {
      local_38 = 0x4600000006;
      uStack_30 = 0x4700000007;
      local_48 = 2;
      uStack_44 = 0x44;
      uStack_40 = 5;
      uStack_3c = 0x45;
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_80,&local_48,&stack0xffffffffffffffd8,0,&local_141,&local_142,&local_143)
      ;
      local_138._0_4_ = String;
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(local_138 + 8),&local_80);
      local_140 = 3;
      local_13c = 0x48;
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_b8,&local_140,local_138,0,&local_144,&local_145,&local_146);
      local_f8 = 2;
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&local_f0,&local_b8);
      std::
      _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>const*>
                ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&visit::map,local_138,&local_b8,0,&local_147,&local_148,&local_149);
      lVar5 = 0x48;
      do {
        std::
        _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(local_138 + lVar5));
        lVar5 = lVar5 + -0x40;
      } while (lVar5 != -0x38);
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_b8);
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_80);
      __cxa_atexit(std::
                   unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
                   ::~unordered_map,&visit::map,&__dso_handle);
      __cxa_guard_release(&visit(flow::CastInstr&)::map);
    }
  }
  LVar1 = (castInstr->super_Instr).super_Value.type_;
  value = *(castInstr->super_Instr).operands_.
           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (LVar1 == value->type_) {
    emitLoad(this,value);
  }
  else {
    local_138._0_4_ = LVar1;
    cVar3 = std::
            _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&visit::map._M_h,(key_type *)local_138);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      __assert_fail("i != map.end() && \"Cast target type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x200,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    local_138._0_4_ =
         (*(castInstr->super_Instr).operands_.
           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start)->type_;
    cVar4 = std::
            _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)cVar3.
                             super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                             ._M_cur + 0x10),(key_type *)local_138);
    if (cVar4.super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>.
        _M_cur == (__node_type *)0x0) {
      __assert_fail("k != sub.end() && \"Cast source type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x205,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    opc = *(Opcode *)
           ((long)cVar4.
                  super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>
                  ._M_cur + 0xc);
    emitLoad(this,*(castInstr->super_Instr).operands_.
                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
    emitInstr(this,opc);
    changeStack(this,1,(Value *)castInstr);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CastInstr& castInstr) {
  // map of (target, source, opcode)
  static const std::unordered_map<
      LiteralType,
      std::unordered_map<LiteralType, Opcode>> map = {
        {LiteralType::String, {
          {LiteralType::Number, Opcode::N2S},
          {LiteralType::IPAddress, Opcode::P2S},
          {LiteralType::Cidr, Opcode::C2S},
          {LiteralType::RegExp, Opcode::R2S},
        }},
        {LiteralType::Number, {
          {LiteralType::String, Opcode::S2N},
        }},
      };

  // just alias same-type casts
  if (castInstr.type() == castInstr.source()->type()) {
    emitLoad(castInstr.source());
    return;
  }

  // lookup target type
  const auto i = map.find(castInstr.type());
  assert(i != map.end() && "Cast target type not found.");

  // lookup source type
  const auto& sub = i->second;
  auto k = sub.find(castInstr.source()->type());
  assert(k != sub.end() && "Cast source type not found.");
  Opcode op = k->second;

  // emit instruction
  emitLoad(castInstr.source());
  emitInstr(op);
  changeStack(1, &castInstr);
}